

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,Geometry *g)

{
  ostream *this;
  ostream *poVar1;
  Geometry *in_RSI;
  ostream *in_RDI;
  ostream *in_stack_ffffffffffffffa8;
  RealBox *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  CoordSys *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ostream *in_stack_ffffffffffffffe8;
  
  this = operator<<((ostream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8);
  Geometry::ProbDomain(in_RSI);
  operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Geometry::Domain(in_RSI);
  poVar1 = operator<<(in_stack_ffffffffffffffe8,
                      (Box *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  std::operator<<(poVar1,'P');
  Geometry::isPeriodic(in_RSI);
  IntVect::IntVect((IntVect *)this,(Array<int,_3> *)in_stack_ffffffffffffffa8);
  operator<<(in_stack_ffffffffffffffa8,(IntVect *)0x1031d6a);
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream&   os,
            const Geometry& g)
{
    os << (CoordSys&) g << g.ProbDomain() << g.Domain() << 'P' << IntVect(g.isPeriodic());
    return os;
}